

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

int __thiscall roaring::Roaring64Map::remove(Roaring64Map *this,char *__filename)

{
  iterator iter;
  _Rb_tree_header *extraout_RAX;
  _Rb_tree_header *p_Var1;
  key_type local_1c;
  
  local_1c = (key_type)((ulong)__filename >> 0x20);
  iter = std::
         _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                 *)this,&local_1c);
  p_Var1 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iter._M_node != p_Var1) {
    Roaring::remove((Roaring *)&iter._M_node[1]._M_parent,(char *)((ulong)__filename & 0xffffffff));
    eraseIfEmpty(this,(iterator)iter._M_node);
    p_Var1 = extraout_RAX;
  }
  return (int)p_Var1;
}

Assistant:

void remove(uint64_t x) {
        auto iter = roarings.find(highBytes(x));
        if (iter == roarings.end()) {
            return;
        }
        auto &bitmap = iter->second;
        bitmap.remove(lowBytes(x));
        eraseIfEmpty(iter);
    }